

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_CmdLineParser.h
# Opt level: O0

bool __thiscall
axl::sl::CmdLineParser<CmdLineParser,_CmdLineSwitchTable>::processArg
          (CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *this,StringRef *arg)

{
  bool bVar1;
  ArgKind AVar2;
  C *pCVar3;
  size_t sVar4;
  C *pCVar5;
  SwitchInfo *pSVar6;
  byte *pbVar7;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  C *in_RDI;
  SwitchInfo *switchInfo_1;
  size_t i;
  size_t length;
  SwitchInfo *switchInfo;
  ArgKind argKind;
  String value;
  String switchName;
  CmdLineParser *self;
  bool result;
  StringRef *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  char in_stack_fffffffffffffe97;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffea9;
  undefined1 in_stack_fffffffffffffeaa;
  undefined1 in_stack_fffffffffffffeab;
  undefined4 in_stack_fffffffffffffeac;
  SwitchInfo *in_stack_fffffffffffffeb0;
  StringRef *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ArgKind AVar8;
  ulong local_b8;
  bool local_1;
  
  AVar8 = (ArgKind)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  if ((*(uint *)(in_RDI + 0x28) & 1) == 0) {
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x135f97);
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x135fa4);
    AVar2 = CmdLineParserRoot::getArgKind
                      ((StringRef *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    if (AVar2 == ArgKind_Value) {
      local_1 = processValue((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)
                             CONCAT44(in_stack_fffffffffffffeac,
                                      CONCAT13(in_stack_fffffffffffffeab,
                                               CONCAT12(in_stack_fffffffffffffeaa,
                                                        CONCAT11(in_stack_fffffffffffffea9,
                                                                 in_stack_fffffffffffffea8)))),
                             (StringRef *)
                             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    }
    else if (AVar2 == ArgKind_StringSwitch) {
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                (in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,
                          CONCAT13(in_stack_fffffffffffffeab,
                                   CONCAT12(in_stack_fffffffffffffeaa,
                                            CONCAT11(in_stack_fffffffffffffea9,
                                                     in_stack_fffffffffffffea8)))));
      bVar1 = CmdLineParserRoot::parseSwitch
                        (AVar8,in_stack_fffffffffffffeb8,(String *)in_stack_fffffffffffffeb0,
                         (String *)
                         CONCAT44(in_stack_fffffffffffffeac,
                                  CONCAT13(in_stack_fffffffffffffeab,
                                           CONCAT12(in_stack_fffffffffffffeaa,
                                                    CONCAT11(in_stack_fffffffffffffea9,
                                                             in_stack_fffffffffffffea8)))));
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1360b9);
      if (bVar1) {
        pSVar6 = CmdLineSwitchTable::findSwitch
                           ((StringRef *)
                            CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        if (pSVar6 == (SwitchInfo *)0x0) {
          pCVar3 = StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                             ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
                              CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
          err::setFormatStringError("unknown switch --%s",pCVar3);
          local_1 = false;
        }
        else {
          local_1 = processSwitch((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)
                                  in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                  (StringRef *)
                                  CONCAT44(in_stack_fffffffffffffeac,
                                           CONCAT13(in_stack_fffffffffffffeab,
                                                    CONCAT12(in_stack_fffffffffffffeaa,
                                                             CONCAT11(in_stack_fffffffffffffea9,
                                                                      in_stack_fffffffffffffea8)))),
                                  (StringRef *)
                                  CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      sVar4 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getLength(in_RSI);
      for (local_b8 = 1; local_b8 < sVar4; local_b8 = local_b8 + 1) {
        pCVar5 = StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator[](in_RSI,local_b8)
        ;
        AVar8 = (ArgKind)((ulong)pCVar5 >> 0x20);
        pSVar6 = CmdLineSwitchTable::findSwitch(in_stack_fffffffffffffe97);
        if (pSVar6 == (SwitchInfo *)0x0) {
          pbVar7 = (byte *)StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator[]
                                     (in_RSI,local_b8);
          err::setFormatStringError("unknown switch -%c",(ulong)*pbVar7);
          local_1 = false;
          goto LAB_00136424;
        }
        if (pSVar6->m_value != (char *)0x0) {
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::getSubString
                    ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)pSVar6,
                     (size_t)in_stack_fffffffffffffeb0,
                     CONCAT44(AVar2,CONCAT13(in_stack_fffffffffffffeab,
                                             CONCAT12(in_stack_fffffffffffffeaa,
                                                      CONCAT11(in_stack_fffffffffffffea9,
                                                               in_stack_fffffffffffffea8)))));
          bVar1 = CmdLineParserRoot::parseSwitch
                            (AVar8,(StringRef *)pSVar6,(String *)in_stack_fffffffffffffeb0,
                             (String *)
                             CONCAT44(AVar2,CONCAT13(in_stack_fffffffffffffeab,
                                                     CONCAT12(in_stack_fffffffffffffeaa,
                                                              CONCAT11(in_stack_fffffffffffffea9,
                                                                       in_stack_fffffffffffffea8))))
                            );
          local_1 = false;
          if (bVar1) {
            local_1 = processSwitch((CmdLineParser<CmdLineParser,_CmdLineSwitchTable> *)pSVar6,
                                    in_stack_fffffffffffffeb0,
                                    (StringRef *)
                                    CONCAT44(AVar2,CONCAT13(bVar1,(uint3)CONCAT11(
                                                  in_stack_fffffffffffffea9,
                                                  in_stack_fffffffffffffea8))),
                                    (StringRef *)
                                    CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          }
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                    ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x136346);
          goto LAB_00136424;
        }
        in_stack_fffffffffffffea4 = pSVar6->m_switchKind;
        pCVar5 = in_RDI;
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RDI);
        in_stack_fffffffffffffe97 =
             ::CmdLineParser::onSwitch
                       ((CmdLineParser *)
                        CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                        (SwitchKind)((ulong)pCVar5 >> 0x20),
                        (StringRef *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
                  ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1363d8);
      }
      local_1 = true;
    }
LAB_00136424:
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x136431);
    StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x13643e);
  }
  else {
    local_1 = ::CmdLineParser::onValue
                        ((CmdLineParser *)
                         CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe88);
  }
  return local_1;
}

Assistant:

bool
	processArg(const sl::StringRef& arg) {
		bool result;

		T* self = static_cast<T*>(this);

		if (m_flags & Flag_Forward)
			return self->onValue(arg);

		sl::String switchName;
		sl::String value;

		ArgKind argKind = getArgKind(arg);
		switch (argKind) {
		case ArgKind_Value:
			return processValue(arg);

		case ArgKind_StringSwitch:
			result = parseSwitch(argKind, arg.getSubString(2), &switchName, &value);
			if (!result)
				return false;

			const SwitchInfo* switchInfo = SwitchTable::findSwitch(switchName);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch --%s", switchName.sz());
				return false;
			}

			return processSwitch(switchInfo, switchName, value);
		}

		ASSERT(argKind == ArgKind_CharSwitch);

		size_t length = arg.getLength();
		for (size_t i = 1; i < length; i++) {
			const SwitchInfo* switchInfo = SwitchTable::findSwitch(arg[i]);
			if (!switchInfo) {
				err::setFormatStringError("unknown switch -%c", (uchar_t) arg [i]);
				return false;
			}

			if (switchInfo->m_value) {
				return
					parseSwitch(argKind, arg.getSubString(i), &switchName, &value) &&
					processSwitch(switchInfo, switchName, value);
			}

			result = self->onSwitch((SwitchKind)switchInfo->m_switchKind, NULL);
		}

		return true;
	}